

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_iq3_xxs_q8_K
               (int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256 x_00;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 (*pauVar12) [32];
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m256i p2;
  __m256i p1;
  uint16_t ls2;
  uint16_t ls1;
  __m256i dot2;
  __m256i dot1;
  __m256i q8s_2;
  __m256i q8s_1;
  __m256i s2_2;
  __m256i s2_1;
  __m256i q2_2;
  __m256i q2_1;
  __m256i q8_2;
  __m256i q8_1;
  int ib32;
  __m256i sumi2;
  __m256i sumi1;
  int8_t *q8;
  uint8_t *gas;
  uint8_t *q3;
  float d;
  int i;
  __m256 accumf;
  uint32_t aux32 [2];
  uint64_t *signs64;
  int nb;
  block_q8_K *y;
  block_iq3_xxs *x;
  undefined4 in_stack_fffffffffffff7b8;
  float in_stack_fffffffffffff7bc;
  byte *in_stack_fffffffffffff7c0;
  uint32_t *in_stack_fffffffffffff7c8;
  byte *in_stack_fffffffffffff7d0;
  int local_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 (*local_620) [32];
  undefined8 *local_618;
  byte *local_610;
  int local_604;
  undefined1 local_600 [16];
  uint local_5d8;
  uint uStack_5d4;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  local_600 = ZEXT816(0);
  for (local_604 = 0; local_604 < in_EDI >> 8; local_604 = local_604 + 1) {
    fVar13 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_604 * 0x62));
    in_stack_fffffffffffff7bc = fVar13 * *(float *)(in_R9 + (long)local_604 * 0x124);
    local_618 = (undefined8 *)(in_RCX + 0x42 + (long)local_604 * 0x62);
    local_620 = (undefined1 (*) [32])(in_R9 + 4 + (long)local_604 * 0x124);
    local_640 = ZEXT1632(ZEXT816(0));
    local_660 = ZEXT1632(ZEXT816(0));
    local_664 = 0;
    local_610 = (byte *)(in_RCX + 2 + (long)local_604 * 0x62);
    while( true ) {
      if (7 < local_664) break;
      auVar6 = *local_620;
      pauVar12 = local_620 + 1;
      local_620 = local_620 + 2;
      in_stack_fffffffffffff7c8 = iq3xxs_grid;
      auVar3 = vpinsrd_avx(ZEXT416(iq3xxs_grid[*local_610]),iq3xxs_grid[local_610[1]],1);
      auVar3 = vpinsrd_avx(auVar3,iq3xxs_grid[local_610[2]],2);
      auVar3 = vpinsrd_avx(auVar3,iq3xxs_grid[local_610[3]],3);
      auVar4 = vpinsrd_avx(ZEXT416(iq3xxs_grid[local_610[4]]),iq3xxs_grid[local_610[5]],1);
      auVar4 = vpinsrd_avx(auVar4,iq3xxs_grid[local_610[6]],2);
      auVar4 = vpinsrd_avx(auVar4,iq3xxs_grid[local_610[7]],3);
      uStack_b0 = auVar4._0_8_;
      uStack_a8 = auVar4._8_8_;
      in_stack_fffffffffffff7d0 = local_610 + 8;
      auVar4 = vpinsrd_avx(ZEXT416(iq3xxs_grid[*in_stack_fffffffffffff7d0]),
                           iq3xxs_grid[local_610[9]],1);
      auVar4 = vpinsrd_avx(auVar4,iq3xxs_grid[local_610[10]],2);
      auVar4 = vpinsrd_avx(auVar4,iq3xxs_grid[local_610[0xb]],3);
      auVar15 = vpinsrd_avx(ZEXT416(iq3xxs_grid[local_610[0xc]]),iq3xxs_grid[local_610[0xd]],1);
      auVar15 = vpinsrd_avx(auVar15,iq3xxs_grid[local_610[0xe]],2);
      auVar15 = vpinsrd_avx(auVar15,iq3xxs_grid[local_610[0xf]],3);
      uStack_f0 = auVar15._0_8_;
      uStack_e8 = auVar15._8_8_;
      uVar2 = *local_618;
      local_618 = local_618 + 1;
      local_5d8 = (uint)uVar2;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(local_5d8 & 0x7f) * 8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(local_5d8 >> 7 & 0x7f) * 8);
      auVar15 = vpunpcklqdq_avx(auVar15,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(local_5d8 >> 0xe & 0x7f) * 8);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(local_5d8 >> 0x15 & 0x7f) * 8);
      auVar14 = vpunpcklqdq_avx(auVar17,auVar20);
      uStack_1b0 = auVar14._0_8_;
      uStack_1a8 = auVar14._8_8_;
      uStack_5d4 = (uint)((ulong)uVar2 >> 0x20);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 & 0x7f) * 8);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 >> 7 & 0x7f) * 8);
      auVar14 = vpunpcklqdq_avx(auVar14,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 >> 0xe & 0x7f) * 8);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(keven_signs_q2xs + (ulong)(uStack_5d4 >> 0x15 & 0x7f) * 8);
      auVar16 = vpunpcklqdq_avx(auVar19,auVar21);
      uStack_1f0 = auVar16._0_8_;
      uStack_1e8 = auVar16._8_8_;
      auVar5._16_8_ = uStack_1b0;
      auVar5._0_16_ = auVar15;
      auVar5._24_8_ = uStack_1a8;
      auVar5 = vpsignb_avx2(auVar6,auVar5);
      auVar6._16_8_ = uStack_1f0;
      auVar6._0_16_ = auVar14;
      auVar6._24_8_ = uStack_1e8;
      auVar6 = vpsignb_avx2(*pauVar12,auVar6);
      auVar9._16_8_ = uStack_b0;
      auVar9._0_16_ = auVar3;
      auVar9._24_8_ = uStack_a8;
      auVar5 = vpmaddubsw_avx2(auVar9,auVar5);
      auVar8._16_8_ = uStack_f0;
      auVar8._0_16_ = auVar4;
      auVar8._24_8_ = uStack_e8;
      auVar6 = vpmaddubsw_avx2(auVar8,auVar6);
      uVar1 = ((ushort)((ulong)uVar2 >> 0x10) >> 0xc) * 2 + 1;
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,7);
      uStack_2d0 = auVar4._0_8_;
      uStack_2c8 = auVar4._8_8_;
      auVar11._16_8_ = uStack_2d0;
      auVar11._0_16_ = auVar3;
      auVar11._24_8_ = uStack_2c8;
      auVar5 = vpmaddwd_avx2(auVar5,auVar11);
      uVar1 = (ushort)((ulong)uVar2 >> 0x3c) * 2 + 1;
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,7);
      auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
      uStack_330 = auVar15._0_8_;
      uStack_328 = auVar15._8_8_;
      auVar10._16_8_ = uStack_330;
      auVar10._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
      auVar10._24_8_ = uStack_328;
      auVar6 = vpmaddwd_avx2(auVar6,auVar10);
      local_640 = vpaddd_avx2(local_640,auVar5);
      local_660 = vpaddd_avx2(local_660,auVar6);
      local_664 = local_664 + 2;
      in_stack_fffffffffffff7c0 = local_610;
      local_610 = local_610 + 0x10;
    }
    auVar3 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffff7bc),
                           ZEXT416((uint)in_stack_fffffffffffff7bc),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)in_stack_fffffffffffff7bc),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)in_stack_fffffffffffff7bc),0x30);
    auVar4 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffff7bc),
                           ZEXT416((uint)in_stack_fffffffffffff7bc),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)in_stack_fffffffffffff7bc),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)in_stack_fffffffffffff7bc),0x30);
    uStack_70 = auVar3._0_8_;
    uStack_68 = auVar3._8_8_;
    auVar5 = vpaddd_avx2(local_640,local_660);
    auVar5 = vcvtdq2ps_avx(auVar5);
    auVar7._16_8_ = uStack_70;
    auVar7._0_16_ = auVar4;
    auVar7._24_8_ = uStack_68;
    local_600 = vfmadd213ps_fma(auVar5,auVar7,ZEXT1632(local_600));
  }
  x_00[1] = in_stack_fffffffffffff7bc;
  x_00[0] = (float)in_stack_fffffffffffff7b8;
  x_00._8_8_ = in_stack_fffffffffffff7c0;
  x_00._16_8_ = in_stack_fffffffffffff7c8;
  x_00._24_8_ = in_stack_fffffffffffff7d0;
  fVar13 = hsum_float_8(x_00);
  *in_RSI = fVar13 * 0.25;
  return;
}

Assistant:

void ggml_vec_dot_iq3_xxs_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_iq3_xxs * GGML_RESTRICT x = vx;
    const block_q8_K    * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[2];

    ggml_int8x16x4_t q3s;
    ggml_int8x16x4_t q8b;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT gas = x[i].qs + QK_K/4;
        const int8_t   * GGML_RESTRICT q8 = y[i].qs;
        float sumf1 = 0, sumf2 = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            q8b = ggml_vld1q_s8_x4(q8); q8 += 64;
            memcpy(aux32, gas, 2*sizeof(uint32_t)); gas += 2*sizeof(uint32_t);
            const uint32x4_t aux32x4_0 = ggml_vld1q_u32(iq3xxs_grid[q3[ 0]], iq3xxs_grid[q3[ 1]], iq3xxs_grid[q3[ 2]], iq3xxs_grid[q3[ 3]]);
            const uint32x4_t aux32x4_1 = ggml_vld1q_u32(iq3xxs_grid[q3[ 4]], iq3xxs_grid[q3[ 5]], iq3xxs_grid[q3[ 6]], iq3xxs_grid[q3[ 7]]);
            const uint32x4_t aux32x4_2 = ggml_vld1q_u32(iq3xxs_grid[q3[ 8]], iq3xxs_grid[q3[ 9]], iq3xxs_grid[q3[10]], iq3xxs_grid[q3[11]]);
            const uint32x4_t aux32x4_3 = ggml_vld1q_u32(iq3xxs_grid[q3[12]], iq3xxs_grid[q3[13]], iq3xxs_grid[q3[14]], iq3xxs_grid[q3[15]]);
            q3 += 16;
            q3s.val[0] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[0] >>  0) & 127))), vld1_s8((const void *)(signs64 + ((aux32[0] >>  7) & 127))));
            q3s.val[1] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[0] >> 14) & 127))), vld1_s8((const void *)(signs64 + ((aux32[0] >> 21) & 127))));
            q3s.val[2] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[1] >>  0) & 127))), vld1_s8((const void *)(signs64 + ((aux32[1] >>  7) & 127))));
            q3s.val[3] = vcombine_s8(vld1_s8((const void *)(signs64 + ((aux32[1] >> 14) & 127))), vld1_s8((const void *)(signs64 + ((aux32[1] >> 21) & 127))));
            q3s.val[0] = vmulq_s8(q3s.val[0], vreinterpretq_s8_u32(aux32x4_0));
            q3s.val[1] = vmulq_s8(q3s.val[1], vreinterpretq_s8_u32(aux32x4_1));
            q3s.val[2] = vmulq_s8(q3s.val[2], vreinterpretq_s8_u32(aux32x4_2));
            q3s.val[3] = vmulq_s8(q3s.val[3], vreinterpretq_s8_u32(aux32x4_3));
            const int32x4_t p1 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), q3s.val[0], q8b.val[0]), q3s.val[1], q8b.val[1]);
            const int32x4_t p2 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), q3s.val[2], q8b.val[2]), q3s.val[3], q8b.val[3]);
            sumf1 += vaddvq_s32(p1) * (0.5f + (aux32[0] >> 28));
            sumf2 += vaddvq_s32(p2) * (0.5f + (aux32[1] >> 28));
        }
        sumf += d*(sumf1 + sumf2);
    }
    *s = 0.5f * sumf;

#elif defined(__AVX2__)

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[2];

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT gas = x[i].qs + QK_K/4;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;
        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q8_2 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q2_1 = _mm256_set_epi32(iq3xxs_grid[q3[7]], iq3xxs_grid[q3[6]], iq3xxs_grid[q3[5]], iq3xxs_grid[q3[4]],
                                                  iq3xxs_grid[q3[3]], iq3xxs_grid[q3[2]], iq3xxs_grid[q3[1]], iq3xxs_grid[q3[0]]);
            q3 += 8;
            const __m256i q2_2 = _mm256_set_epi32(iq3xxs_grid[q3[7]], iq3xxs_grid[q3[6]], iq3xxs_grid[q3[5]], iq3xxs_grid[q3[4]],
                                                  iq3xxs_grid[q3[3]], iq3xxs_grid[q3[2]], iq3xxs_grid[q3[1]], iq3xxs_grid[q3[0]]);
            q3 += 8;
            memcpy(aux32, gas, 8); gas += 8;
            const __m256i s2_1 = _mm256_set_epi64x(signs64[(aux32[0] >> 21) & 127], signs64[(aux32[0] >> 14) & 127],
                                                   signs64[(aux32[0] >>  7) & 127], signs64[(aux32[0] >>  0) & 127]);
            const __m256i s2_2 = _mm256_set_epi64x(signs64[(aux32[1] >> 21) & 127], signs64[(aux32[1] >> 14) & 127],
                                                   signs64[(aux32[1] >>  7) & 127], signs64[(aux32[1] >>  0) & 127]);
            const __m256i q8s_1 = _mm256_sign_epi8(q8_1, s2_1);
            const __m256i q8s_2 = _mm256_sign_epi8(q8_2, s2_2);
            const __m256i dot1  = _mm256_maddubs_epi16(q2_1, q8s_1);
            const __m256i dot2  = _mm256_maddubs_epi16(q2_2, q8s_2);
            const uint16_t ls1 = aux32[0] >> 28;
            const uint16_t ls2 = aux32[1] >> 28;
            const __m256i p1 = _mm256_madd_epi16(dot1, _mm256_set1_epi16(2*ls1+1));
            const __m256i p2 = _mm256_madd_epi16(dot2, _mm256_set1_epi16(2*ls2+1));
            sumi1 = _mm256_add_epi32(sumi1, p1);
            sumi2 = _mm256_add_epi32(sumi2, p2);
        }

        accumf = _mm256_fmadd_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(_mm256_add_epi32(sumi1, sumi2)), accumf);

    }

    *s = 0.25f * hsum_float_8(accumf);

#elif defined(__AVX__)
    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[2];

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT gas = x[i].qs + QK_K/4;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;
        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m128i q8_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q2_1_0 = _mm_set_epi32(iq3xxs_grid[q3[3]], iq3xxs_grid[q3[2]], iq3xxs_grid[q3[1]], iq3xxs_grid[q3[0]]);
            const __m128i q2_1_1 = _mm_set_epi32(iq3xxs_grid[q3[7]], iq3xxs_grid[q3[6]], iq3xxs_grid[q3[5]], iq3xxs_grid[q3[4]]);
            q3 += 8;
            const __m128i q2_2_0 = _mm_set_epi32(iq3xxs_grid[q3[3]], iq3xxs_grid[q3[2]], iq3xxs_grid[q3[1]], iq3xxs_grid[q3[0]]);
            const __m128i q2_2_1 = _mm_set_epi32(iq3xxs_grid[q3[7]], iq3xxs_grid[q3[6]], iq3xxs_grid[q3[5]], iq3xxs_grid[q3[4]]);
            q3 += 8;
            memcpy(aux32, gas, 8); gas += 8;
            const __m128i s2_1_0 = _mm_set_epi64x(signs64[(aux32[0] >>  7) & 127], signs64[(aux32[0] >>  0) & 127]);
            const __m128i s2_1_1 = _mm_set_epi64x(signs64[(aux32[0] >> 21) & 127], signs64[(aux32[0] >> 14) & 127]);
            const __m128i s2_2_0 = _mm_set_epi64x(signs64[(aux32[1] >>  7) & 127], signs64[(aux32[1] >>  0) & 127]);
            const __m128i s2_2_1 = _mm_set_epi64x(signs64[(aux32[1] >> 21) & 127], signs64[(aux32[1] >> 14) & 127]);
            const __m128i q8s_1_0 = _mm_sign_epi8(q8_1_0, s2_1_0);
            const __m128i q8s_1_1 = _mm_sign_epi8(q8_1_1, s2_1_1);
            const __m128i q8s_2_0 = _mm_sign_epi8(q8_2_0, s2_2_0);
            const __m128i q8s_2_1 = _mm_sign_epi8(q8_2_1, s2_2_1);
            const __m128i dot1_0  = _mm_maddubs_epi16(q2_1_0, q8s_1_0);
            const __m128i dot1_1  = _mm_maddubs_epi16(q2_1_1, q8s_1_1);
            const __m128i dot2_0  = _mm_maddubs_epi16(q2_2_0, q8s_2_0);
            const __m128i dot2_1  = _mm_maddubs_epi16(q2_2_1, q8s_2_1);
            const uint16_t ls1 = aux32[0] >> 28;
            const uint16_t ls2 = aux32[1] >> 28;
            const __m128i p1_0 = _mm_madd_epi16(dot1_0, _mm_set1_epi16(2*ls1+1));
            const __m128i p1_1 = _mm_madd_epi16(dot1_1, _mm_set1_epi16(2*ls1+1));
            const __m128i p2_0 = _mm_madd_epi16(dot2_0, _mm_set1_epi16(2*ls2+1));
            const __m128i p2_1 = _mm_madd_epi16(dot2_1, _mm_set1_epi16(2*ls2+1));
            sumi1_0 = _mm_add_epi32(sumi1_0, p1_0);
            sumi1_1 = _mm_add_epi32(sumi1_1, p1_1);
            sumi2_0 = _mm_add_epi32(sumi2_0, p2_0);
            sumi2_1 = _mm_add_epi32(sumi2_1, p2_1);
        }

        accumf = _mm256_add_ps(_mm256_mul_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_add_epi32(sumi1_1, sumi2_1), _mm_add_epi32(sumi1_0, sumi2_0)))), accumf);

    }

    *s = 0.25f * hsum_float_8(accumf);

#elif defined(__POWER9_VECTOR__)
    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    const vector int v0 = vec_splats((int32_t)0);

    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    for (int i = 0; i < nb; ++i) {
        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[i].d));
        vector float vyd = vec_splats(y[i].d);
        vector float vd = vec_mul(vxd, vyd);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;

        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint32_t * GGML_RESTRICT signs = (const uint32_t *)(x[i].qs + QK_K/4);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

#pragma GCC unroll 1
        for (int j = 0; j < QK_K/32; j += 2) {
            __builtin_prefetch(q3, 0, 1);
            __builtin_prefetch(q8, 0, 1);

            vector unsigned int aux32x4_0 = {iq3xxs_grid[q3[ 0]], iq3xxs_grid[q3[ 1]], iq3xxs_grid[q3[ 2]], iq3xxs_grid[q3[ 3]]};
            vector unsigned int aux32x4_1 = {iq3xxs_grid[q3[ 4]], iq3xxs_grid[q3[ 5]], iq3xxs_grid[q3[ 6]], iq3xxs_grid[q3[ 7]]};
            vector unsigned int aux32x4_2 = {iq3xxs_grid[q3[ 8]], iq3xxs_grid[q3[ 9]], iq3xxs_grid[q3[10]], iq3xxs_grid[q3[11]]};
            vector unsigned int aux32x4_3 = {iq3xxs_grid[q3[12]], iq3xxs_grid[q3[13]], iq3xxs_grid[q3[14]], iq3xxs_grid[q3[15]]};
            q3 += 16;

            vector unsigned long long aux64x2_0 = {(uint64_t)(signs64[(signs[0] >>  0) & 127]), (uint64_t)(signs64[(signs[0] >>  7) & 127])};
            vector unsigned long long aux64x2_1 = {(uint64_t)(signs64[(signs[0] >> 14) & 127]), (uint64_t)(signs64[(signs[0] >> 21) & 127])};
            vector unsigned long long aux64x2_2 = {(uint64_t)(signs64[(signs[1] >>  0) & 127]), (uint64_t)(signs64[(signs[1] >>  7) & 127])};
            vector unsigned long long aux64x2_3 = {(uint64_t)(signs64[(signs[1] >> 14) & 127]), (uint64_t)(signs64[(signs[1] >> 21) & 127])};

            vector signed char q3x0 = vec_mul((vector signed char)aux64x2_0, (vector signed char)aux32x4_0);
            vector signed char q3x1 = vec_mul((vector signed char)aux64x2_1, (vector signed char)aux32x4_1);
            vector signed char q3x2 = vec_mul((vector signed char)aux64x2_2, (vector signed char)aux32x4_2);
            vector signed char q3x3 = vec_mul((vector signed char)aux64x2_3, (vector signed char)aux32x4_3);

            vector signed char q8y0 = vec_xl( 0, q8);
            vector signed char q8y1 = vec_xl(16, q8);
            vector signed char q8y2 = vec_xl(32, q8);
            vector signed char q8y3 = vec_xl(48, q8);
            q8 += 64;

            vector signed short qv0 = vec_add(vec_mule(q3x0, q8y0), vec_mulo(q3x0, q8y0));
            vector signed short qv1 = vec_add(vec_mule(q3x1, q8y1), vec_mulo(q3x1, q8y1));
            vector signed short qv2 = vec_add(vec_mule(q3x2, q8y2), vec_mulo(q3x2, q8y2));
            vector signed short qv3 = vec_add(vec_mule(q3x3, q8y3), vec_mulo(q3x3, q8y3));

            const uint16_t ls0 = (uint16_t)(signs[0] >> 28);
            const uint16_t ls1 = (uint16_t)(signs[1] >> 28);
            signs += 2;

            vector signed short vscales01 = (vector signed short)vec_splats((uint16_t)(2*ls0+1));
            vector signed short vscales23 = (vector signed short)vec_splats((uint16_t)(2*ls1+1));

            vsumi0 = vec_msum(qv0, vscales01, vsumi0);
            vsumi1 = vec_msum(qv1, vscales01, vsumi1);
            vsumi2 = vec_msum(qv2, vscales23, vsumi2);
            vsumi3 = vec_msum(qv3, vscales23, vsumi3);
        }

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = 0.25f * vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)

    const uint64_t * signs64 = (const uint64_t *)keven_signs_q2xs;

    uint32_t aux32[2];

    __m256 accumf = (__m256)__lasx_xvldi(0);
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT gas = x[i].qs + QK_K/4;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;
        __m256i sumi1 = __lasx_xvldi(0);
        __m256i sumi2 = __lasx_xvldi(0);
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q8_2 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q2_1 = lasx_set_w(iq3xxs_grid[q3[7]], iq3xxs_grid[q3[6]], iq3xxs_grid[q3[5]], iq3xxs_grid[q3[4]],
                                                iq3xxs_grid[q3[3]], iq3xxs_grid[q3[2]], iq3xxs_grid[q3[1]], iq3xxs_grid[q3[0]]);
            q3 += 8;
            const __m256i q2_2 = lasx_set_w(iq3xxs_grid[q3[7]], iq3xxs_grid[q3[6]], iq3xxs_grid[q3[5]], iq3xxs_grid[q3[4]],
                                                iq3xxs_grid[q3[3]], iq3xxs_grid[q3[2]], iq3xxs_grid[q3[1]], iq3xxs_grid[q3[0]]);
            q3 += 8;
            memcpy(aux32, gas, 8); gas += 8;

            const __m256i s2_1 = lasx_set_d(signs64[(aux32[0] >> 21) & 127], signs64[(aux32[0] >> 14) & 127],
                                                   signs64[(aux32[0] >>  7) & 127], signs64[(aux32[0] >>  0) & 127]);
            const __m256i s2_2 = lasx_set_d(signs64[(aux32[1] >> 21) & 127], signs64[(aux32[1] >> 14) & 127],
                                                   signs64[(aux32[1] >>  7) & 127], signs64[(aux32[1] >>  0) & 127]);
            const __m256i q8s_1 = __lasx_xvsigncov_b(s2_1, q8_1);
            const __m256i q8s_2 = __lasx_xvsigncov_b(s2_2, q8_2);
            const __m256i dot1  = lasx_maddubs_h(q2_1, q8s_1);
            const __m256i dot2  = lasx_maddubs_h(q2_2, q8s_2);
            const uint16_t ls1 = aux32[0] >> 28;
            const uint16_t ls2 = aux32[1] >> 28;

            const __m256i p1 = lasx_madd_h(dot1, __lasx_xvreplgr2vr_h(2*ls1+1));
            const __m256i p2 = lasx_madd_h(dot2, __lasx_xvreplgr2vr_h(2*ls2+1));
            sumi1 = __lasx_xvadd_w(sumi1, p1);
            sumi2 = __lasx_xvadd_w(sumi2, p2);
        }

        accumf = __lasx_xvfmadd_s(__lasx_xvreplfr2vr_s(d), __lasx_xvffint_s_w(__lasx_xvadd_w(sumi1, sumi2)), accumf);
    }

    *s = 0.25f * hsum_float_8(accumf);

#else

    uint32_t aux32;

    float sumf = 0.f;
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT q3 = x[i].qs;
        const uint8_t * GGML_RESTRICT gas = x[i].qs + QK_K/4;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;
        int32_t bsum = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(&aux32, gas, sizeof(uint32_t)); gas += sizeof(uint32_t);
            const uint32_t ls = 2*(aux32 >> 28) + 1;
            int32_t sumi = 0;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3xxs_grid + q3[2*l+0]);
                const uint8_t * grid2 = (const uint8_t *)(iq3xxs_grid + q3[2*l+1]);
                const uint8_t  signs = ksigns_iq2xs[(aux32 >> 7*l) & 127];
                for (int j = 0; j < 4; ++j) {
                    sumi += grid1[j] * q8[j+0] * (signs & kmask_iq2xs[j+0] ? -1 : 1);
                    sumi += grid2[j] * q8[j+4] * (signs & kmask_iq2xs[j+4] ? -1 : 1);
                }
                q8 += 8;
            }
            q3 += 8;
            bsum += sumi * ls;
        }
        sumf += d * bsum;
    }
    *s = 0.25f * sumf;
#endif
}